

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<Fad<float>_>::Read(TPZMatrixSolver<Fad<float>_> *this,TPZStream *buf,void *context)

{
  void *in_RDX;
  TPZStream *in_RSI;
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *in_stack_ffffffffffffff98;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *in_stack_ffffffffffffffa0;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *this_00;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> local_48 [4];
  TPZAutoPointer<TPZSavable> *in_stack_ffffffffffffffd8;
  
  TPZSavable::Read(in_RDI,in_RSI,in_RDX);
  TPZPersistenceManager::GetAutoPointer((TPZStream *)in_RDI);
  TPZAutoPointerDynamicCast<TPZMatrix<Fad<float>>,TPZSavable>(in_stack_ffffffffffffffd8);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::~TPZAutoPointer(in_stack_ffffffffffffffa0);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer
            ((TPZAutoPointer<TPZSavable> *)in_stack_ffffffffffffffa0);
  this_00 = local_48;
  TPZPersistenceManager::GetAutoPointer((TPZStream *)in_RDI);
  TPZAutoPointerDynamicCast<TPZMatrix<Fad<float>>,TPZSavable>(in_stack_ffffffffffffffd8);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(this_00,in_stack_ffffffffffffff98);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::~TPZAutoPointer(this_00);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer((TPZAutoPointer<TPZSavable> *)this_00);
  return;
}

Assistant:

void TPZMatrixSolver<TVar>::Read(TPZStream &buf, void *context)
{
	TPZSolver::Read(buf,context);
	fContainer = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(TPZPersistenceManager::GetAutoPointer(&buf));
	fReferenceMatrix = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(TPZPersistenceManager::GetAutoPointer(&buf));
}